

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBook.c
# Opt level: O0

void Io_NtkWriteLatchNode(FILE *pFile,Abc_Obj_t *pLatch,int NodesOrPl)

{
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *pAVar2;
  char *pcVar3;
  char *pcVar4;
  Abc_Obj_t *pNetLo;
  Abc_Obj_t *pNetLi;
  int NodesOrPl_local;
  Abc_Obj_t *pLatch_local;
  FILE *pFile_local;
  
  pAVar1 = Abc_ObjFanin0(pLatch);
  pAVar1 = Abc_ObjFanin0(pAVar1);
  pAVar2 = Abc_ObjFanout0(pLatch);
  pAVar2 = Abc_ObjFanout0(pAVar2);
  pcVar3 = Abc_ObjName(pAVar1);
  pcVar4 = Abc_ObjName(pAVar2);
  fprintf((FILE *)pFile,"%s_%s_latch\t",pcVar3,pcVar4);
  if (NodesOrPl == 0) {
    fprintf((FILE *)pFile," %d %d\n",6,1);
  }
  return;
}

Assistant:

void Io_NtkWriteLatchNode( FILE * pFile, Abc_Obj_t * pLatch, int NodesOrPl )
{
    Abc_Obj_t * pNetLi, * pNetLo;
    
    pNetLi = Abc_ObjFanin0( Abc_ObjFanin0(pLatch) );
    pNetLo = Abc_ObjFanout0( Abc_ObjFanout0(pLatch) );
    /// write the latch line
    fprintf( pFile, "%s_%s_latch\t", Abc_ObjName(pNetLi), Abc_ObjName(pNetLo) );
    if (NodesOrPl == NODES)
        fprintf( pFile, " %d %d\n", 6, 1 );
}